

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O2

void __thiscall
basisu::vector<basisu::basisu_backend_slice_desc>::resize
          (vector<basisu::basisu_backend_slice_desc> *this,size_t new_size_size_t,bool grow_hint)

{
  uint uVar1;
  uint32_t min_new_capacity;
  
  if (new_size_size_t >> 0x20 == 0) {
    uVar1 = this->m_size;
    min_new_capacity = (uint32_t)new_size_size_t;
    if (uVar1 != min_new_capacity) {
      if (uVar1 <= min_new_capacity) {
        if (this->m_capacity < min_new_capacity) {
          increase_capacity(this,min_new_capacity,uVar1 + 1 == min_new_capacity || grow_hint,false);
          uVar1 = this->m_size;
        }
        construct_array<basisu::basisu_backend_slice_desc>
                  (this->m_p + uVar1,(ulong)(min_new_capacity - uVar1));
      }
      this->m_size = min_new_capacity;
    }
    return;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                ,0x217,
                "void basisu::vector<basisu::basisu_backend_slice_desc>::resize(size_t, bool) [T = basisu::basisu_backend_slice_desc]"
               );
}

Assistant:

inline void resize(size_t new_size_size_t, bool grow_hint = false)
      {
         if (new_size_size_t > UINT32_MAX)
         {
            assert(0);
            return;
         }

         uint32_t new_size = (uint32_t)new_size_size_t;

         if (m_size != new_size)
         {
            if (new_size < m_size)
               scalar_type<T>::destruct_array(m_p + new_size, m_size - new_size);
            else
            {
               if (new_size > m_capacity)
                  increase_capacity(new_size, (new_size == (m_size + 1)) || grow_hint);

               scalar_type<T>::construct_array(m_p + m_size, new_size - m_size);
            }

            m_size = new_size;
         }
      }